

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void __thiscall FM::OPNB::DataLoad(OPNB *this,OPNBData *data,void *adpcmadata)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint8 *__dest;
  size_t __size;
  long lVar5;
  Channel4 *this_00;
  
  OPNABase::DataLoad(&this->super_OPNABase,&data->opnabase);
  iVar1 = data->adpcmasize;
  __size = (size_t)iVar1;
  if (__size != 0) {
    __dest = (uint8 *)malloc(__size);
    this->adpcmabuf = __dest;
    memcpy(__dest,adpcmadata,__size);
  }
  this->adpcmasize = iVar1;
  memcpy(this->adpcma,data->adpcma,0xd8);
  this->adpcmatl = data->adpcmatl;
  this->adpcmatvol = data->adpcmatvol;
  this->adpcmakey = data->adpcmakey;
  this->adpcmastep = data->adpcmastep;
  uVar2 = *(undefined8 *)data->adpcmareg;
  uVar3 = *(undefined8 *)(data->adpcmareg + 8);
  uVar4 = *(undefined8 *)(data->adpcmareg + 0x18);
  *(undefined8 *)(this->adpcmareg + 0x10) = *(undefined8 *)(data->adpcmareg + 0x10);
  *(undefined8 *)(this->adpcmareg + 0x18) = uVar4;
  *(undefined8 *)this->adpcmareg = uVar2;
  *(undefined8 *)(this->adpcmareg + 8) = uVar3;
  this_00 = (Channel4 *)&this->field_0x14d8;
  lVar5 = 0;
  do {
    Channel4::DataLoad(this_00,(Channel4Data *)((long)data->ch[0].buf + lVar5 + -4));
    lVar5 = lVar5 + 0x238;
    this_00 = this_00 + 1;
  } while (lVar5 != 0xd50);
  (this->super_OPNABase).super_OPNBase.csmch = (Channel4 *)&this->field_0x1a98;
  return;
}

Assistant:

void OPNB::DataLoad(struct OPNBData* data, void* adpcmadata) {
	OPNABase::DataLoad(&data->opnabase);  // libOPNMIDI: bugfix DataLoad (was DataSave here)
	if(data->adpcmasize) {
		adpcmabuf = (uint8*)malloc(data->adpcmasize);
		memcpy(adpcmabuf, adpcmadata, data->adpcmasize);
	}
	adpcmasize = data->adpcmasize;
	memcpy(adpcma, data->adpcma, sizeof(ADPCMA) * 6);
	adpcmatl = data->adpcmatl;
	adpcmatvol = data->adpcmatvol;
	adpcmakey = data->adpcmakey;
	adpcmastep = data->adpcmastep;
	memcpy(adpcmareg, data->adpcmareg, 32);
	for(int i = 0; i < 6; i++) {
		ch[i].DataLoad(&data->ch[i]);
	}
	csmch = &ch[2];
}